

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3ExprCodeIN(Parse *pParse,Expr *pExpr,int destIfFalse,int destIfNull)

{
  Vdbe *p;
  ExprList *pEVar1;
  int iVar2;
  uint uVar3;
  int p1;
  int iVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  Expr *pEVar8;
  CollSeq *zP4;
  byte bVar9;
  int *piVar10;
  long lVar11;
  ExprList_item *pEVar12;
  int *piVar13;
  int *piVar14;
  int local_90;
  int local_88;
  int iTab;
  Expr *local_68;
  int *local_60;
  int local_54;
  int local_50;
  int rRhsHasNull;
  byte *local_48;
  int local_3c;
  int regToFree;
  int iDummy;
  
  rRhsHasNull = 0;
  iTab = 0;
  pEVar8 = pExpr->pLeft;
  iVar2 = sqlite3ExprCheckIN(pParse,pExpr);
  if (iVar2 != 0) {
    return;
  }
  local_48 = (byte *)exprINAffinity(pParse,pExpr);
  uVar3 = sqlite3ExprVectorSize(pExpr->pLeft);
  piVar7 = (int *)sqlite3DbMallocZero(pParse->db,(long)(int)uVar3 * 5 + 1);
  if (pParse->db->mallocFailed != '\0') goto LAB_00179155;
  p = pParse->pVdbe;
  piVar13 = (int *)0x0;
  piVar10 = &rRhsHasNull;
  if (destIfFalse == destIfNull) {
    piVar10 = piVar13;
  }
  local_68 = pEVar8;
  iVar2 = sqlite3FindInIndex(pParse,pExpr,3,piVar10,piVar7,&iTab);
  p1 = exprCodeVector(pParse,local_68,&iDummy);
  piVar10 = (int *)0x0;
  if (0 < (int)uVar3) {
    piVar10 = (int *)(ulong)uVar3;
  }
  for (; (piVar14 = piVar10, piVar10 != piVar13 &&
         (piVar14 = piVar13, piVar13 == (int *)(ulong)(uint)piVar7[(long)piVar13]));
      piVar13 = (int *)((long)piVar13 + 1)) {
  }
  local_60 = piVar7;
  local_50 = p1;
  if ((uint)piVar14 != uVar3) {
    p1 = sqlite3GetTempRange(pParse,uVar3);
    iVar4 = local_50;
    for (piVar7 = (int *)0x0; piVar10 != piVar7; piVar7 = (int *)((long)piVar7 + 1)) {
      sqlite3VdbeAddOp3(p,0x4e,iVar4 + (int)piVar7,local_60[(long)piVar7] + p1,0);
    }
  }
  piVar7 = local_60;
  if (iVar2 == 5) {
    pEVar1 = (pExpr->x).pList;
    local_68 = (Expr *)sqlite3ExprCollSeq(pParse,pExpr->pLeft);
    iVar2 = pParse->nLabel + -1;
    iVar4 = 0;
    pParse->nLabel = iVar2;
    if (destIfFalse != destIfNull) {
      iVar4 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(p,0x60,p1,p1,iVar4);
    }
    pEVar12 = pEVar1->a;
    for (lVar11 = 0; lVar11 < pEVar1->nExpr; lVar11 = lVar11 + 1) {
      iVar5 = sqlite3ExprCodeTemp(pParse,pEVar12->pExpr,&regToFree);
      if ((iVar4 != 0) && (iVar6 = sqlite3ExprCanBeNull(pEVar12->pExpr), iVar6 != 0)) {
        sqlite3VdbeAddOp3(p,0x60,iVar4,iVar5,iVar4);
      }
      if ((destIfFalse == destIfNull) && ((long)pEVar1->nExpr + -1 <= lVar11)) {
        sqlite3VdbeAddOp4(p,0x34,p1,destIfFalse,iVar5,(char *)local_68,-2);
        uVar3 = p->nOp;
        if (0 < (int)uVar3) {
          bVar9 = *local_48 | 0x10;
LAB_00178e01:
          p->aOp[(ulong)uVar3 - 1].p5 = (short)(char)bVar9;
        }
      }
      else {
        sqlite3VdbeAddOp4(p,0x35,p1,iVar2,iVar5,(char *)local_68,-2);
        uVar3 = p->nOp;
        if (0 < (int)uVar3) {
          bVar9 = *local_48;
          goto LAB_00178e01;
        }
      }
      if (regToFree != 0) {
        bVar9 = pParse->nTempReg;
        if ((ulong)bVar9 < 8) {
          pParse->nTempReg = bVar9 + 1;
          pParse->aTempReg[bVar9] = regToFree;
        }
      }
      pEVar12 = pEVar12 + 1;
    }
    if (iVar4 == 0) {
      sqlite3VdbeResolveLabel(p,iVar2);
      piVar7 = local_60;
    }
    else {
      sqlite3VdbeAddOp2(p,0x32,iVar4,destIfNull);
      sqlite3VdbeGoto(p,destIfFalse);
      sqlite3VdbeResolveLabel(p,iVar2);
      bVar9 = pParse->nTempReg;
      piVar7 = local_60;
      if ((ulong)bVar9 < 8) {
        pParse->nTempReg = bVar9 + 1;
        pParse->aTempReg[bVar9] = iVar4;
      }
    }
  }
  else {
    local_88 = 0;
    iVar4 = destIfFalse;
    iVar5 = 0;
    if (destIfFalse != destIfNull) {
      iVar4 = pParse->nLabel + -1;
      pParse->nLabel = iVar4;
      iVar5 = 0;
      local_88 = iVar4;
    }
    for (; (int)piVar10 != iVar5; iVar5 = iVar5 + 1) {
      pEVar8 = sqlite3VectorFieldSubexpr(pExpr->pLeft,iVar5);
      iVar6 = sqlite3ExprCanBeNull(pEVar8);
      if (iVar6 != 0) {
        sqlite3VdbeAddOp2(p,0x32,p1 + iVar5,iVar4);
      }
    }
    if (iVar2 == 1) {
      local_90 = iTab;
      sqlite3VdbeAddOp3(p,0x1e,iTab,destIfFalse,p1);
      local_54 = sqlite3VdbeAddOp0(p,0xb);
    }
    else {
      sqlite3VdbeAddOp4(p,0x5b,p1,uVar3,0,(char *)local_48,uVar3);
      if (destIfFalse == destIfNull) {
        sqlite3VdbeAddOp4Int(p,0x1c,iTab,destIfFalse,p1,uVar3);
        goto LAB_00179128;
      }
      local_90 = iTab;
      local_54 = sqlite3VdbeAddOp4Int(p,0x1d,iTab,0,p1,uVar3);
    }
    if (uVar3 == 1 && rRhsHasNull != 0) {
      sqlite3VdbeAddOp2(p,0x33,rRhsHasNull,destIfFalse);
    }
    if (destIfFalse == destIfNull) {
      sqlite3VdbeGoto(p,destIfFalse);
    }
    if (local_88 != 0) {
      sqlite3VdbeResolveLabel(p,local_88);
    }
    local_3c = sqlite3VdbeAddOp2(p,0x24,local_90,destIfFalse);
    local_88 = destIfFalse;
    if (1 < (int)uVar3) {
      local_88 = pParse->nLabel + -1;
      pParse->nLabel = local_88;
    }
    for (iVar2 = 0; (int)piVar10 != iVar2; iVar2 = iVar2 + 1) {
      iVar4 = sqlite3GetTempReg(pParse);
      pEVar8 = sqlite3VectorFieldSubexpr(local_68,iVar2);
      zP4 = sqlite3ExprCollSeq(pParse,pEVar8);
      sqlite3VdbeAddOp3(p,0x5a,local_90,iVar2,iVar4);
      sqlite3VdbeAddOp4(p,0x34,p1 + iVar2,local_88,iVar4,(char *)zP4,-2);
      if (iVar4 != 0) {
        bVar9 = pParse->nTempReg;
        if ((ulong)bVar9 < 8) {
          pParse->nTempReg = bVar9 + 1;
          pParse->aTempReg[bVar9] = iVar4;
        }
      }
      piVar7 = local_60;
    }
    sqlite3VdbeAddOp2(p,0xb,0,destIfNull);
    if (1 < (int)uVar3) {
      sqlite3VdbeResolveLabel(p,local_88);
      sqlite3VdbeAddOp2(p,5,local_90,local_3c + 1);
      sqlite3VdbeAddOp2(p,0xb,0,destIfFalse);
    }
    sqlite3VdbeJumpHere(p,local_54);
  }
LAB_00179128:
  if (p1 != 0 && p1 != local_50) {
    bVar9 = pParse->nTempReg;
    if ((ulong)bVar9 < 8) {
      pParse->nTempReg = bVar9 + 1;
      pParse->aTempReg[bVar9] = p1;
    }
  }
LAB_00179155:
  sqlite3DbFree(pParse->db,piVar7);
  sqlite3DbFree(pParse->db,local_48);
  return;
}

Assistant:

static void sqlite3ExprCodeIN(
  Parse *pParse,        /* Parsing and code generating context */
  Expr *pExpr,          /* The IN expression */
  int destIfFalse,      /* Jump here if LHS is not contained in the RHS */
  int destIfNull        /* Jump here if the results are unknown due to NULLs */
){
  int rRhsHasNull = 0;  /* Register that is true if RHS contains NULL values */
  int eType;            /* Type of the RHS */
  int rLhs;             /* Register(s) holding the LHS values */
  int rLhsOrig;         /* LHS values prior to reordering by aiMap[] */
  Vdbe *v;              /* Statement under construction */
  int *aiMap = 0;       /* Map from vector field to index column */
  char *zAff = 0;       /* Affinity string for comparisons */
  int nVector;          /* Size of vectors for this IN operator */
  int iDummy;           /* Dummy parameter to exprCodeVector() */
  Expr *pLeft;          /* The LHS of the IN operator */
  int i;                /* loop counter */
  int destStep2;        /* Where to jump when NULLs seen in step 2 */
  int destStep6 = 0;    /* Start of code for Step 6 */
  int addrTruthOp;      /* Address of opcode that determines the IN is true */
  int destNotNull;      /* Jump here if a comparison is not true in step 6 */
  int addrTop;          /* Top of the step-6 loop */ 
  int iTab = 0;         /* Index to use */

  pLeft = pExpr->pLeft;
  if( sqlite3ExprCheckIN(pParse, pExpr) ) return;
  zAff = exprINAffinity(pParse, pExpr);
  nVector = sqlite3ExprVectorSize(pExpr->pLeft);
  aiMap = (int*)sqlite3DbMallocZero(
      pParse->db, nVector*(sizeof(int) + sizeof(char)) + 1
  );
  if( pParse->db->mallocFailed ) goto sqlite3ExprCodeIN_oom_error;

  /* Attempt to compute the RHS. After this step, if anything other than
  ** IN_INDEX_NOOP is returned, the table opened with cursor iTab
  ** contains the values that make up the RHS. If IN_INDEX_NOOP is returned,
  ** the RHS has not yet been coded.  */
  v = pParse->pVdbe;
  assert( v!=0 );       /* OOM detected prior to this routine */
  VdbeNoopComment((v, "begin IN expr"));
  eType = sqlite3FindInIndex(pParse, pExpr,
                             IN_INDEX_MEMBERSHIP | IN_INDEX_NOOP_OK,
                             destIfFalse==destIfNull ? 0 : &rRhsHasNull,
                             aiMap, &iTab);

  assert( pParse->nErr || nVector==1 || eType==IN_INDEX_EPH
       || eType==IN_INDEX_INDEX_ASC || eType==IN_INDEX_INDEX_DESC 
  );
#ifdef SQLITE_DEBUG
  /* Confirm that aiMap[] contains nVector integer values between 0 and
  ** nVector-1. */
  for(i=0; i<nVector; i++){
    int j, cnt;
    for(cnt=j=0; j<nVector; j++) if( aiMap[j]==i ) cnt++;
    assert( cnt==1 );
  }
#endif

  /* Code the LHS, the <expr> from "<expr> IN (...)". If the LHS is a 
  ** vector, then it is stored in an array of nVector registers starting 
  ** at r1.
  **
  ** sqlite3FindInIndex() might have reordered the fields of the LHS vector
  ** so that the fields are in the same order as an existing index.   The
  ** aiMap[] array contains a mapping from the original LHS field order to
  ** the field order that matches the RHS index.
  */
  rLhsOrig = exprCodeVector(pParse, pLeft, &iDummy);
  for(i=0; i<nVector && aiMap[i]==i; i++){} /* Are LHS fields reordered? */
  if( i==nVector ){
    /* LHS fields are not reordered */
    rLhs = rLhsOrig;
  }else{
    /* Need to reorder the LHS fields according to aiMap */
    rLhs = sqlite3GetTempRange(pParse, nVector);
    for(i=0; i<nVector; i++){
      sqlite3VdbeAddOp3(v, OP_Copy, rLhsOrig+i, rLhs+aiMap[i], 0);
    }
  }

  /* If sqlite3FindInIndex() did not find or create an index that is
  ** suitable for evaluating the IN operator, then evaluate using a
  ** sequence of comparisons.
  **
  ** This is step (1) in the in-operator.md optimized algorithm.
  */
  if( eType==IN_INDEX_NOOP ){
    ExprList *pList = pExpr->x.pList;
    CollSeq *pColl = sqlite3ExprCollSeq(pParse, pExpr->pLeft);
    int labelOk = sqlite3VdbeMakeLabel(pParse);
    int r2, regToFree;
    int regCkNull = 0;
    int ii;
    assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
    if( destIfNull!=destIfFalse ){
      regCkNull = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(v, OP_BitAnd, rLhs, rLhs, regCkNull);
    }
    for(ii=0; ii<pList->nExpr; ii++){
      r2 = sqlite3ExprCodeTemp(pParse, pList->a[ii].pExpr, &regToFree);
      if( regCkNull && sqlite3ExprCanBeNull(pList->a[ii].pExpr) ){
        sqlite3VdbeAddOp3(v, OP_BitAnd, regCkNull, r2, regCkNull);
      }
      if( ii<pList->nExpr-1 || destIfNull!=destIfFalse ){
        sqlite3VdbeAddOp4(v, OP_Eq, rLhs, labelOk, r2,
                          (void*)pColl, P4_COLLSEQ);
        VdbeCoverageIf(v, ii<pList->nExpr-1);
        VdbeCoverageIf(v, ii==pList->nExpr-1);
        sqlite3VdbeChangeP5(v, zAff[0]);
      }else{
        assert( destIfNull==destIfFalse );
        sqlite3VdbeAddOp4(v, OP_Ne, rLhs, destIfFalse, r2,
                          (void*)pColl, P4_COLLSEQ); VdbeCoverage(v);
        sqlite3VdbeChangeP5(v, zAff[0] | SQLITE_JUMPIFNULL);
      }
      sqlite3ReleaseTempReg(pParse, regToFree);
    }
    if( regCkNull ){
      sqlite3VdbeAddOp2(v, OP_IsNull, regCkNull, destIfNull); VdbeCoverage(v);
      sqlite3VdbeGoto(v, destIfFalse);
    }
    sqlite3VdbeResolveLabel(v, labelOk);
    sqlite3ReleaseTempReg(pParse, regCkNull);
    goto sqlite3ExprCodeIN_finished;
  }

  /* Step 2: Check to see if the LHS contains any NULL columns.  If the
  ** LHS does contain NULLs then the result must be either FALSE or NULL.
  ** We will then skip the binary search of the RHS.
  */
  if( destIfNull==destIfFalse ){
    destStep2 = destIfFalse;
  }else{
    destStep2 = destStep6 = sqlite3VdbeMakeLabel(pParse);
  }
  for(i=0; i<nVector; i++){
    Expr *p = sqlite3VectorFieldSubexpr(pExpr->pLeft, i);
    if( sqlite3ExprCanBeNull(p) ){
      sqlite3VdbeAddOp2(v, OP_IsNull, rLhs+i, destStep2);
      VdbeCoverage(v);
    }
  }

  /* Step 3.  The LHS is now known to be non-NULL.  Do the binary search
  ** of the RHS using the LHS as a probe.  If found, the result is
  ** true.
  */
  if( eType==IN_INDEX_ROWID ){
    /* In this case, the RHS is the ROWID of table b-tree and so we also
    ** know that the RHS is non-NULL.  Hence, we combine steps 3 and 4
    ** into a single opcode. */
    sqlite3VdbeAddOp3(v, OP_SeekRowid, iTab, destIfFalse, rLhs);
    VdbeCoverage(v);
    addrTruthOp = sqlite3VdbeAddOp0(v, OP_Goto);  /* Return True */
  }else{
    sqlite3VdbeAddOp4(v, OP_Affinity, rLhs, nVector, 0, zAff, nVector);
    if( destIfFalse==destIfNull ){
      /* Combine Step 3 and Step 5 into a single opcode */
      sqlite3VdbeAddOp4Int(v, OP_NotFound, iTab, destIfFalse,
                           rLhs, nVector); VdbeCoverage(v);
      goto sqlite3ExprCodeIN_finished;
    }
    /* Ordinary Step 3, for the case where FALSE and NULL are distinct */
    addrTruthOp = sqlite3VdbeAddOp4Int(v, OP_Found, iTab, 0,
                                      rLhs, nVector); VdbeCoverage(v);
  }

  /* Step 4.  If the RHS is known to be non-NULL and we did not find
  ** an match on the search above, then the result must be FALSE.
  */
  if( rRhsHasNull && nVector==1 ){
    sqlite3VdbeAddOp2(v, OP_NotNull, rRhsHasNull, destIfFalse);
    VdbeCoverage(v);
  }

  /* Step 5.  If we do not care about the difference between NULL and
  ** FALSE, then just return false. 
  */
  if( destIfFalse==destIfNull ) sqlite3VdbeGoto(v, destIfFalse);

  /* Step 6: Loop through rows of the RHS.  Compare each row to the LHS.
  ** If any comparison is NULL, then the result is NULL.  If all
  ** comparisons are FALSE then the final result is FALSE.
  **
  ** For a scalar LHS, it is sufficient to check just the first row
  ** of the RHS.
  */
  if( destStep6 ) sqlite3VdbeResolveLabel(v, destStep6);
  addrTop = sqlite3VdbeAddOp2(v, OP_Rewind, iTab, destIfFalse);
  VdbeCoverage(v);
  if( nVector>1 ){
    destNotNull = sqlite3VdbeMakeLabel(pParse);
  }else{
    /* For nVector==1, combine steps 6 and 7 by immediately returning
    ** FALSE if the first comparison is not NULL */
    destNotNull = destIfFalse;
  }
  for(i=0; i<nVector; i++){
    Expr *p;
    CollSeq *pColl;
    int r3 = sqlite3GetTempReg(pParse);
    p = sqlite3VectorFieldSubexpr(pLeft, i);
    pColl = sqlite3ExprCollSeq(pParse, p);
    sqlite3VdbeAddOp3(v, OP_Column, iTab, i, r3);
    sqlite3VdbeAddOp4(v, OP_Ne, rLhs+i, destNotNull, r3,
                      (void*)pColl, P4_COLLSEQ);
    VdbeCoverage(v);
    sqlite3ReleaseTempReg(pParse, r3);
  }
  sqlite3VdbeAddOp2(v, OP_Goto, 0, destIfNull);
  if( nVector>1 ){
    sqlite3VdbeResolveLabel(v, destNotNull);
    sqlite3VdbeAddOp2(v, OP_Next, iTab, addrTop+1);
    VdbeCoverage(v);

    /* Step 7:  If we reach this point, we know that the result must
    ** be false. */
    sqlite3VdbeAddOp2(v, OP_Goto, 0, destIfFalse);
  }

  /* Jumps here in order to return true. */
  sqlite3VdbeJumpHere(v, addrTruthOp);

sqlite3ExprCodeIN_finished:
  if( rLhs!=rLhsOrig ) sqlite3ReleaseTempReg(pParse, rLhs);
  VdbeComment((v, "end IN expr"));
sqlite3ExprCodeIN_oom_error:
  sqlite3DbFree(pParse->db, aiMap);
  sqlite3DbFree(pParse->db, zAff);
}